

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O0

pair<long,_bool> readCount(string *path)

{
  byte bVar1;
  undefined8 uVar2;
  pair<int,_bool> pVar3;
  undefined8 extraout_RDX;
  pair<long,_bool> pVar4;
  bool local_275;
  int local_274;
  pair<int,_bool> local_270;
  string *local_268;
  undefined1 local_260;
  bool local_251;
  long local_250;
  int64_t n;
  int local_240;
  pair<int,_bool> local_23c [2];
  istream local_228 [8];
  ifstream file;
  string *path_local;
  bool local_10;
  
  uVar2 = std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_228,uVar2,8);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    local_240 = 0;
    n._7_1_ = 0;
    pVar3 = std::make_pair<int,bool>(&local_240,(bool *)((long)&n + 7));
    local_23c[0].first = pVar3.first;
    local_23c[0].second = pVar3.second;
    std::pair<long,_bool>::pair<int,_bool,_true>((pair<long,_bool> *)&path_local,local_23c);
  }
  else {
    local_250 = 0;
    std::istream::operator>>(local_228,&local_250);
    bVar1 = std::ios::good();
    if ((bVar1 & 1) == 0) {
      local_274 = 0;
      local_275 = false;
      pVar3 = std::make_pair<int,bool>(&local_274,&local_275);
      local_270.first = pVar3.first;
      local_270.second = pVar3.second;
      std::pair<long,_bool>::pair<int,_bool,_true>((pair<long,_bool> *)&path_local,&local_270);
    }
    else {
      local_251 = true;
      pVar4 = std::make_pair<long&,bool>(&local_250,&local_251);
      local_268 = (string *)pVar4.first;
      local_260 = pVar4.second;
      path_local = local_268;
      local_10 = (bool)local_260;
    }
  }
  n._0_4_ = 1;
  std::ifstream::~ifstream(local_228);
  pVar4._9_7_ = (undefined7)((ulong)extraout_RDX >> 8);
  pVar4.second = local_10;
  pVar4.first = (long)path_local;
  return pVar4;
}

Assistant:

std::pair<int64_t, bool> readCount(const std::string& path) {
  std::ifstream file(path.c_str());
  if (!file.is_open())
    return std::make_pair(0, false);
  int64_t n = 0;
  file >> n;
  if (file.good())
    return std::make_pair(n, true);
  return std::make_pair(0, false);
}